

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O1

int hmacResult(HMACContext *ctx,uint8_t *digest)

{
  USHAContext *ctx_00;
  int iVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (ctx != (HMACContext *)0x0) {
    ctx_00 = &ctx->shaContext;
    iVar1 = USHAResult(ctx_00,digest);
    if (iVar1 == 0) {
      iVar1 = USHAReset(ctx_00,ctx->whichSha);
      if (iVar1 == 0) {
        iVar1 = USHAInput(ctx_00,ctx->k_opad,ctx->blockSize);
        if (iVar1 == 0) {
          iVar1 = USHAInput(ctx_00,digest,ctx->hashSize);
          if (iVar1 == 0) {
            iVar1 = USHAResult(ctx_00,digest);
            uVar2 = (uint)(iVar1 != 0);
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int hmacResult(HMACContext *ctx, uint8_t digest[USHAMaxHashSize])
{
    if (!ctx) return shaNull;

    /* finish up 1st pass */
    /* (Use digest here as a temporary buffer.) */
    return USHAResult(&ctx->shaContext, digest) ||

        /* perform outer SHA */
        /* init context for 2nd pass */
        USHAReset(&ctx->shaContext, (SHAversion)ctx->whichSha) ||

        /* start with outer pad */
        USHAInput(&ctx->shaContext, ctx->k_opad, ctx->blockSize) ||

        /* then results of 1st hash */
        USHAInput(&ctx->shaContext, digest, ctx->hashSize) ||

        /* finish up 2nd pass */
        USHAResult(&ctx->shaContext, digest);
}